

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

QOffscreenSurface * QRhiGles2InitParams::newFallbackSurface(QSurfaceFormat *format)

{
  long lVar1;
  bool bVar2;
  QOffscreenSurface *this;
  long in_FS_OFFSET;
  undefined1 local_58 [20];
  undefined4 local_44;
  char *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QSurfaceFormat fmt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fmt.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QSurfaceFormat::QSurfaceFormat(&fmt,format);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::QOpenGLContext((QOpenGLContext *)&local_38,(QObject *)0x0);
  QOpenGLContext::setFormat((QOpenGLContext *)&local_38,&fmt);
  bVar2 = QOpenGLContext::create((QOpenGLContext *)&local_38);
  if (bVar2) {
    QOpenGLContext::format((QOpenGLContext *)local_58);
    QSurfaceFormat::operator=(&fmt,(QSurfaceFormat *)local_58);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_58);
  }
  else {
    local_58._0_4_ = 2;
    local_44 = 0;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_40 = "default";
    QMessageLogger::warning(local_58);
  }
  this = (QOffscreenSurface *)operator_new(0x28);
  QOffscreenSurface::QOffscreenSurface(this,(QScreen *)0x0,(QObject *)0x0);
  QOffscreenSurface::setFormat(this,&fmt);
  QOffscreenSurface::create(this);
  QOpenGLContext::~QOpenGLContext((QOpenGLContext *)&local_38);
  QSurfaceFormat::~QSurfaceFormat(&fmt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenSurface *QRhiGles2InitParams::newFallbackSurface(const QSurfaceFormat &format)
{
    QSurfaceFormat fmt = format;

    // To resolve all fields in the format as much as possible, create a context.
    // This may be heavy, but allows avoiding BAD_MATCH on some systems.
    QOpenGLContext tempContext;
    tempContext.setFormat(fmt);
    if (tempContext.create())
        fmt = tempContext.format();
    else
        qWarning("QRhiGles2: Failed to create temporary context");

    QOffscreenSurface *s = new QOffscreenSurface;
    s->setFormat(fmt);
    s->create();

    return s;
}